

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

int Saig_ManPhaseFrameNum(Aig_Man_t *p,Vec_Int_t *vInits)

{
  Vec_Ptr_t *p_00;
  uint uVar1;
  Saig_Tsim_t *p_01;
  uint *pState;
  int iVar2;
  
  if (p->nRegs == 0) {
    __assert_fail("Saig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                  ,0x34d,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
  }
  if (p->nTruePis != 0) {
    if (p->nTruePos != 0) {
      p_01 = Saig_ManReachableTernary(p,vInits,0);
      if (p_01 == (Saig_Tsim_t *)0x0) {
        iVar2 = 1;
      }
      else {
        p_00 = p_01->vStates;
        pState = (uint *)Vec_PtrEntryLast(p_00);
        uVar1 = Saig_TsiComputePrefix(p_01,pState,p_01->nWords);
        iVar2 = ~uVar1 + p_00->nSize;
        Saig_TsiStop(p_01);
      }
      return iVar2;
    }
    __assert_fail("Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                  ,0x34f,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
  }
  __assert_fail("Saig_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                ,0x34e,"int Saig_ManPhaseFrameNum(Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

int Saig_ManPhaseFrameNum( Aig_Man_t * p, Vec_Int_t * vInits )
{
    Saig_Tsim_t * pTsi;
    int nFrames, nPrefix;
    assert( Saig_ManRegNum(p) );
    assert( Saig_ManPiNum(p) );
    assert( Saig_ManPoNum(p) );
    // perform terminary simulation
    pTsi = Saig_ManReachableTernary( p, vInits, 0 );
    if ( pTsi == NULL )
        return 1;
    // derive information
    nPrefix = Saig_TsiComputePrefix( pTsi, (unsigned *)Vec_PtrEntryLast(pTsi->vStates), pTsi->nWords );
    nFrames = Vec_PtrSize(pTsi->vStates) - 1 - nPrefix;
    Saig_TsiStop( pTsi );
    // potentially, may need to reduce nFrames if nPrefix is less than nFrames
    return nFrames;
}